

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O3

int arrow_array_stream_wrapper::anon_unknown_0::GetNext(ArrowArrayStream *stream,ArrowArray *out)

{
  void *pvVar1;
  long lVar2;
  int64_t *piVar3;
  code *pcVar4;
  ArrowArray *pAVar5;
  
  pvVar1 = stream->private_data;
  piVar3 = *(int64_t **)((long)pvVar1 + 8);
  pAVar5 = out;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pAVar5->length = *piVar3;
    piVar3 = piVar3 + 1;
    pAVar5 = (ArrowArray *)&pAVar5->null_count;
  }
  pcVar4 = (_func_void_ArrowArray_ptr *)0x0;
  if (*(char *)((long)pvVar1 + 0x10) == '\0') {
    pcVar4 = EmptyArrayRelease;
  }
  out->release = pcVar4;
  *(undefined1 *)((long)pvVar1 + 0x10) = 1;
  return 0;
}

Assistant:

int GetNext(struct ArrowArrayStream *stream, struct ArrowArray *out) {
	auto private_data = static_cast<arrow_array_stream_wrapper::PrivateData *>((stream->private_data));
	*out = *private_data->array;
	if (private_data->done) {
		out->release = nullptr;
	} else {
		out->release = EmptyArrayRelease;
	}

	private_data->done = true;
	return DuckDBSuccess;
}